

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional3::getExpectedPrimitivesSubmittedQueryResult
          (PipelineStatisticsQueryTestFunctional3 *this,_primitive_type current_primitive_type,
          uint *out_results_written,GLuint64 *out_results)

{
  bool bVar1;
  uint uVar2;
  _draw_call_type _Var3;
  ulong uVar4;
  long lVar5;
  TestError *this_00;
  long lVar6;
  uint uVar7;
  
  uVar2 = (this->super_PipelineStatisticsQueryTestFunctionalBase).
          m_indirect_draw_call_count_argument;
  *out_results_written = 0;
  if (PRIMITIVE_TYPE_TRIANGLES_ADJACENCY < current_primitive_type) {
switchD_00a3f6da_caseD_5:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized primitive type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
               ,0xceb);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  bVar1 = this->m_is_primitive_restart_enabled;
  uVar7 = uVar2 - bVar1;
  switch(current_primitive_type) {
  case PRIMITIVE_TYPE_FIRST:
    *out_results_written = 1;
LAB_00a3f7e2:
    *out_results = (ulong)uVar7;
    break;
  case PRIMITIVE_TYPE_LINE_LOOP:
    *out_results_written = 1;
    if (2 < uVar7) goto LAB_00a3f7e2;
    if (uVar7 == 2) {
      *out_results = 1;
    }
    else {
      *out_results = 0;
    }
    break;
  case PRIMITIVE_TYPE_LINE_STRIP:
    if (uVar7 < 2) {
      *out_results_written = 1;
      *out_results = 0;
      lVar5 = 1;
      if (uVar7 != 1) goto LAB_00a3f817;
LAB_00a3f804:
      *out_results_written = 2;
      out_results[1] = 1;
      goto LAB_00a3f812;
    }
    uVar7 = uVar7 - 1;
    goto LAB_00a3f796;
  case PRIMITIVE_TYPE_LINES:
    *out_results_written = 1;
    *out_results = (ulong)(uVar7 >> 1);
    lVar5 = 1;
    if ((uVar7 & 1) == 0) goto LAB_00a3f817;
    *out_results_written = 2;
    out_results[1] = (ulong)((uVar7 >> 1) + 1);
LAB_00a3f812:
    lVar5 = 2;
    goto LAB_00a3f817;
  case PRIMITIVE_TYPE_LINES_ADJACENCY:
    uVar4 = (ulong)(uVar7 >> 2);
    *out_results_written = 1;
    *out_results = uVar4;
    if ((uVar7 & 3) != 0) {
LAB_00a3f77c:
      *out_results_written = 2;
      out_results[1] = (ulong)((int)uVar4 + 1);
      goto LAB_00a3f812;
    }
    break;
  case PRIMITIVE_TYPE_PATCHES:
    goto switchD_00a3f6da_caseD_5;
  default:
    if (uVar7 < 3) {
      *out_results_written = 1;
      *out_results = 0;
      lVar5 = 1;
      if (uVar2 == bVar1) goto LAB_00a3f817;
      goto LAB_00a3f804;
    }
    uVar7 = uVar7 - 2;
LAB_00a3f796:
    *out_results_written = 1;
    *out_results = (ulong)uVar7;
    break;
  case PRIMITIVE_TYPE_TRIANGLES:
    uVar4 = (ulong)uVar7 / 3;
    *out_results_written = 1;
    *out_results = uVar4;
    if (0x55555555 < uVar7 * -0x55555555) goto LAB_00a3f77c;
    break;
  case PRIMITIVE_TYPE_TRIANGLES_ADJACENCY:
    uVar4 = (ulong)uVar7 / 6;
    *out_results_written = 1;
    *out_results = uVar4;
    if (0x2aaaaaaa < (uVar7 * -0x55555555 >> 1 | (uint)((uVar7 * -0x55555555 & 1) != 0) << 0x1f))
    goto LAB_00a3f77c;
  }
  lVar5 = 1;
LAB_00a3f817:
  _Var3 = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_draw_call_type;
  if ((_Var3 < DRAW_CALL_TYPE_GLDRAWRANGEELEMENTS) && ((0x3ceU >> (_Var3 & 0x1f) & 1) != 0)) {
    uVar2 = (this->super_PipelineStatisticsQueryTestFunctionalBase).
            m_indirect_draw_call_primcount_argument;
    lVar6 = 0;
    do {
      out_results[lVar6] = out_results[lVar6] * (ulong)uVar2;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctional3::getExpectedPrimitivesSubmittedQueryResult(
	PipelineStatisticsQueryUtilities::_primitive_type current_primitive_type, unsigned int* out_results_written,
	glw::GLuint64 out_results[4])
{
	unsigned int n_input_vertices = m_indirect_draw_call_count_argument;

	*out_results_written = 0;

	/* Sanity checks */
	DE_ASSERT(current_primitive_type != PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_PATCHES);

	/* Carry on */
	if (m_is_primitive_restart_enabled)
	{
		/* Primitive restart functionality in our test removes a single index.
		 *
		 * Note: This also applies to arrayed draw calls, since we're testing
		 *       GL_PRIMITIVE_RESTART rendering mode, and we're using a primitive
		 *       restart index of 0.
		 **/
		n_input_vertices--;
	}

	switch (current_primitive_type)
	{
	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_POINTS:
	{
		out_results[(*out_results_written)++] = n_input_vertices;

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINE_LOOP:
	{
		if (n_input_vertices > 2)
		{
			out_results[(*out_results_written)++] = n_input_vertices;
		}
		else if (n_input_vertices > 1)
		{
			out_results[(*out_results_written)++] = 1;
		}
		else
		{
			out_results[(*out_results_written)++] = 0;
		}

		break;
	} /* PRIMITIVE_TYPE_LINE_LOOP */

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLE_FAN:
	{
		if (n_input_vertices > 2)
		{
			out_results[(*out_results_written)++] = n_input_vertices - 2;
		}
		else
		{
			out_results[(*out_results_written)++] = 0;

			if (n_input_vertices >= 1)
			{
				/* If the submitted triangle fan is incomplete, also include the case
				 * where the incomplete triangle fan's vertices are counted as a primitive.
				 */
				out_results[(*out_results_written)++] = 1;
			}
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINE_STRIP:
	{
		if (n_input_vertices > 1)
		{
			out_results[(*out_results_written)++] = n_input_vertices - 1;
		}
		else
		{
			out_results[(*out_results_written)++] = 0;

			if (n_input_vertices > 0)
			{
				/* If the submitted line strip is incomplete, also include the case
				 * where the incomplete line's vertices are counted as a primitive.
				 */
				out_results[(*out_results_written)++] = 1;
			}
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLE_STRIP:
	{
		if (n_input_vertices > 2)
		{
			out_results[(*out_results_written)++] = n_input_vertices - 2;
		}
		else
		{
			out_results[(*out_results_written)++] = 0;

			if (n_input_vertices >= 1)
			{
				/* If the submitted triangle strip is incomplete, also include the case
				 * where the incomplete triangle's vertices are counted as a primitive.
				 */
				out_results[(*out_results_written)++] = 1;
			}
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINES:
	{
		out_results[(*out_results_written)++] = n_input_vertices / 2;

		/* If the submitted line is incomplete, also include the case where
		 * the incomplete line's vertices are counted as a primitive.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 2) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices / 2 + 1;
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINES_ADJACENCY:
	{
		out_results[(*out_results_written)++] = n_input_vertices / 4;

		/* If the submitted line is incomplete, also include the case where
		 * the incomplete line's vertices are counted as a primitive.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 4) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices / 4 + 1;
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLES:
	{
		out_results[(*out_results_written)++] = n_input_vertices / 3;

		/* If the submitted triangle is incomplete, also include the case
		 * when the incomplete triangle's vertices are counted as a primitive.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 3) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices / 3 + 1;
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLES_ADJACENCY:
	{
		out_results[(*out_results_written)++] = n_input_vertices / 6;

		/* If the submitted triangle is incomplete, also include the case
		 * when the incomplete triangle's vertices are counted as a primitive.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 6) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices / 6 + 1;
		}

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized primitive type");
	}
	} /* switch (current_primitive_type) */

	if (PipelineStatisticsQueryUtilities::isInstancedDrawCall(m_current_draw_call_type))
	{
		for (unsigned int i = 0; i < *out_results_written; ++i)
		{
			out_results[i] *= m_indirect_draw_call_primcount_argument;
		}
	} /* if (instanced draw call type) */
}